

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall
PStruct::SetPointer(PStruct *this,void *base,uint offset,
                   TArray<unsigned_long,_unsigned_long> *special)

{
  PField **ppPVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(this->Fields).Count;
  if (uVar4 != 0) {
    ppPVar1 = (this->Fields).Array;
    lVar3 = 0;
    do {
      lVar2 = *(long *)((long)ppPVar1 + lVar3);
      if ((*(byte *)(lVar2 + 0x3a) & 2) == 0) {
        (**(code **)(**(long **)(lVar2 + 0x30) + 0x60))
                  (*(long **)(lVar2 + 0x30),base,*(int *)(lVar2 + 0x28) + offset,special);
      }
      lVar3 = lVar3 + 8;
    } while (uVar4 << 3 != lVar3);
  }
  return;
}

Assistant:

void DumpTypeTable()
{
	int used = 0;
	int min = INT_MAX;
	int max = 0;
	int all = 0;
	int lens[10] = {0};
	for (size_t i = 0; i < countof(TypeTable.TypeHash); ++i)
	{
		int len = 0;
		Printf("%4zu:", i);
		for (PType *ty = TypeTable.TypeHash[i]; ty != NULL; ty = ty->HashNext)
		{
			Printf(" -> %s", ty->IsKindOf(RUNTIME_CLASS(PNamedType)) ? static_cast<PNamedType*>(ty)->TypeName.GetChars(): ty->GetClass()->TypeName.GetChars());
			len++;
			all++;
		}
		if (len != 0)
		{
			used++;
			if (len < min)
				min = len;
			if (len > max)
				max = len;
		}
		if (len < (int)countof(lens))
		{
			lens[len]++;
		}
		Printf("\n");
	}
	Printf("Used buckets: %d/%lu (%.2f%%) for %d entries\n", used, countof(TypeTable.TypeHash), double(used)/countof(TypeTable.TypeHash)*100, all);
	Printf("Min bucket size: %d\n", min);
	Printf("Max bucket size: %d\n", max);
	Printf("Avg bucket size: %.2f\n", double(all) / used);
	int j,k;
	for (k = countof(lens)-1; k > 0; --k)
		if (lens[k])
			break;
	for (j = 0; j <= k; ++j)
		Printf("Buckets of len %d: %d (%.2f%%)\n", j, lens[j], j!=0?double(lens[j])/used*100:-1.0);
}